

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O0

UnicodeSet * __thiscall
icu_63::UnicodeSet::applyPattern(UnicodeSet *this,UnicodeString *pattern,UErrorCode *status)

{
  int iVar1;
  UBool UVar2;
  int32_t iVar3;
  int local_4c [2];
  int32_t i;
  undefined1 local_38 [8];
  ParsePosition pos;
  UErrorCode *status_local;
  UnicodeString *pattern_local;
  UnicodeSet *this_local;
  
  pos._8_8_ = status;
  ParsePosition::ParsePosition((ParsePosition *)local_38,0);
  applyPatternIgnoreSpace
            (this,pattern,(ParsePosition *)local_38,(SymbolTable *)0x0,(UErrorCode *)pos._8_8_);
  UVar2 = ::U_FAILURE(*(UErrorCode *)pos._8_8_);
  if (UVar2 == '\0') {
    local_4c[0] = ParsePosition::getIndex((ParsePosition *)local_38);
    ICU_Utility::skipWhitespace(pattern,local_4c,'\x01');
    iVar1 = local_4c[0];
    iVar3 = UnicodeString::length(pattern);
    if (iVar1 != iVar3) {
      *(undefined4 *)pos._8_8_ = 1;
    }
  }
  local_4c[1] = 1;
  ParsePosition::~ParsePosition((ParsePosition *)local_38);
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::applyPattern(const UnicodeString& pattern,
                                     UErrorCode& status) {
    // Equivalent to
    //   return applyPattern(pattern, USET_IGNORE_SPACE, NULL, status);
    // but without dependency on closeOver().
    ParsePosition pos(0);
    applyPatternIgnoreSpace(pattern, pos, NULL, status);
    if (U_FAILURE(status)) return *this;

    int32_t i = pos.getIndex();
    // Skip over trailing whitespace
    ICU_Utility::skipWhitespace(pattern, i, TRUE);
    if (i != pattern.length()) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    return *this;
}